

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O3

bool __thiscall S2ShapeIndex::Iterator::Locate(Iterator *this,S2Point *target)

{
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var1;
  S2CellId SVar2;
  char cVar3;
  bool bVar4;
  ulong in_RAX;
  S2CellId target_1;
  S2CellId local_18;
  
  local_18.id_ = in_RAX;
  S2CellId::S2CellId(&local_18,target);
  _Var1._M_head_impl =
       (this->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x30))
            (_Var1._M_head_impl,local_18.id_);
  _Var1._M_head_impl =
       (this->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  SVar2.id_ = ((_Var1._M_head_impl)->id_).id_;
  if ((SVar2.id_ != 0xffffffffffffffff) &&
     (SVar2.id_ - (~SVar2.id_ & SVar2.id_ - 1) <= local_18.id_)) {
    return true;
  }
  cVar3 = (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x28))();
  if ((cVar3 == '\0') ||
     (SVar2.id_ = (((this->iter_)._M_t.
                    super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).
                  id_, bVar4 = true, (SVar2.id_ - 1 | SVar2.id_) < local_18.id_)) {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Locate(const S2Point& target) {
      return IteratorBase::LocateImpl(target, this);
    }